

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject.h
# Opt level: O3

shared_ptr<Human> __thiscall
cinject::InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_>::createInstance
          (InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_> *this,
          InjectionContext *context)

{
  pointer pcVar1;
  InjectionContext *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Human> sVar2;
  ContextGuard guard;
  undefined1 local_a9;
  ctor_arg_resolver local_a8;
  long local_a0;
  undefined1 local_98 [24];
  char *local_80 [2];
  char local_70 [16];
  ctor_arg_resolver_1st<Human> local_60;
  ctor_arg_resolver local_58;
  ctor_arg_resolver local_50;
  ContextGuard local_48;
  
  pcVar1 = context[1].componentStack_.
           super__Vector_base<cinject::component_type,_std::allocator<cinject::component_type>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_a8.context_ = (InjectionContext *)local_98;
  if (pcVar1 == (pointer)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Human being","");
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,context[1].container_,
               (long)&(context[1].container_)->parentContainer_ + (long)pcVar1);
  }
  local_98._16_8_ = &Human::typeinfo;
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,local_a8.context_,
             (undefined1 *)((long)&(local_a8.context_)->container_ + local_a0));
  ContextGuard::ContextGuard(&local_48,in_RDX,(component_type *)(local_98 + 0x10));
  if (local_80[0] != local_70) {
    operator_delete(local_80[0]);
  }
  if (local_a8.context_ != (InjectionContext *)local_98) {
    operator_delete(local_a8.context_);
  }
  ContextGuard::ensureNoCycle(&local_48);
  this->_vptr_InstanceStorage = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Human,std::allocator<Human>,cinject::ctor_arg_resolver&,cinject::ctor_arg_resolver&,cinject::ctor_arg_resolver&,cinject::ctor_arg_resolver_1st<Human>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->field_0x8,(Human **)this,
             (allocator<Human> *)&local_a9,&local_a8,&local_50,&local_58,&local_60);
  ContextGuard::~ContextGuard(&local_48);
  sVar2.super___shared_ptr<Human,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar2.super___shared_ptr<Human,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Human>)sVar2.super___shared_ptr<Human,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TImplementation> createInstance(InjectionContext* context)
    {
        ContextGuard guard(context, make_component_type<TImplementation>(!name_.empty() ? name_ : type_name<TImplementation>::value()));

        guard.ensureNoCycle();

        return factory_.createInstance(context);
    }